

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O3

int enable_domain_check(TLS_IO_INSTANCE *tlsInstance)

{
  char *__s;
  int iVar1;
  undefined8 uVar2;
  size_t sVar3;
  
  if (tlsInstance->ignore_host_name_check == false) {
    uVar2 = SSL_get0_param(tlsInstance->ssl);
    X509_VERIFY_PARAM_set_hostflags(uVar2,0);
    iVar1 = X509_VERIFY_PARAM_set1_ip_asc(uVar2,tlsInstance->hostname);
    if (iVar1 == 0) {
      __s = tlsInstance->hostname;
      sVar3 = strlen(__s);
      iVar1 = X509_VERIFY_PARAM_set1_host(uVar2,__s,sVar3);
      if (iVar1 == 0) {
        return 0x418;
      }
    }
    SSL_set_verify((SSL *)tlsInstance->ssl,1,(callback *)0x0);
  }
  return 0;
}

Assistant:

static int enable_domain_check(TLS_IO_INSTANCE* tlsInstance)
{
    int result = 0;

    if (!tlsInstance->ignore_host_name_check)
    {
#if (OPENSSL_VERSION_NUMBER < 0x10002000L)
#error "OpenSSL v1.0.2 or above required. See https://wiki.openssl.org/index.php/Hostname_validation for details."
#endif
        X509_VERIFY_PARAM *param = SSL_get0_param(tlsInstance->ssl);

        X509_VERIFY_PARAM_set_hostflags(param, 0);
        if (!(X509_VERIFY_PARAM_set1_ip_asc(param, tlsInstance->hostname) ||
              X509_VERIFY_PARAM_set1_host(param, tlsInstance->hostname, strlen(tlsInstance->hostname))))
        {
            result = MU_FAILURE;
        }
        else
        {
            SSL_set_verify(tlsInstance->ssl, SSL_VERIFY_PEER, NULL);
        }
    }

    return result;
}